

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

char * myBuf2Str(uint count,char *buf)

{
  undefined8 in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  
  if (buf != (char *)0x0 && count != 0) {
    uVar1 = 0x28;
    if (count < 0x28) {
      uVar1 = (ulong)count;
    }
    pcVar3 = myBuf2Str::str;
    uVar2 = 0;
    do {
      sprintf(pcVar3,"%02X ",(ulong)(uint)(int)buf[uVar2]);
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar3 + 3;
    } while (uVar1 != uVar2);
    pcVar3 = (char *)(ulong)((int)uVar1 * 3 - 1);
    pcVar3[0x1cdf30] = '\0';
    return pcVar3;
  }
  myBuf2Str::str[0] = '\0';
  return (char *)CONCAT71((int7)((ulong)in_RAX >> 8),count == 0);
}

Assistant:

static char *myBuf2Str(unsigned count, char *buf)
{
   static char str[128];
   int i, c;

   if (count && buf)
   {
      if (count > 40) c = 40; else c = count;

      for (i=0; i<c; i++) sprintf(str+(3*i), "%02X ", buf[i]);
      str[(3*c)-1] = 0;
   }
   else str[0] = 0;

   return str;
}